

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::InsertLinkDirectory(cmTarget *this,string *entry,cmListFileBacktrace *bt,bool before)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  const_iterator __position;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  __position._M_current =
       *(cmListFileBacktrace **)
        ((long)&(_Var1._M_head_impl)->LinkDirectoriesBacktraces + (ulong)!before * 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&(_Var1._M_head_impl)->LinkDirectoriesEntries,
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)&(_Var1._M_head_impl)->LinkDirectoriesEntries + (ulong)!before * 8),entry);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::insert
            (&((this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
              LinkDirectoriesBacktraces,__position,bt);
  return;
}

Assistant:

void cmTarget::InsertLinkDirectory(std::string const& entry,
                                   cmListFileBacktrace const& bt, bool before)
{
  std::vector<std::string>::iterator position = before
    ? impl->LinkDirectoriesEntries.begin()
    : impl->LinkDirectoriesEntries.end();

  std::vector<cmListFileBacktrace>::iterator btPosition = before
    ? impl->LinkDirectoriesBacktraces.begin()
    : impl->LinkDirectoriesBacktraces.end();

  impl->LinkDirectoriesEntries.insert(position, entry);
  impl->LinkDirectoriesBacktraces.insert(btPosition, bt);
}